

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

char * __thiscall leveldb::Arena::AllocateAligned(Arena *this,size_t bytes)

{
  ulong uVar1;
  long local_50;
  char *local_40;
  char *result;
  size_t needed;
  size_t slop;
  size_t current_mod;
  int align;
  size_t bytes_local;
  Arena *this_local;
  
  uVar1 = (ulong)this->alloc_ptr_ & 7;
  if (uVar1 == 0) {
    local_50 = 0;
  }
  else {
    local_50 = 8 - uVar1;
  }
  uVar1 = bytes + local_50;
  if (this->alloc_bytes_remaining_ < uVar1) {
    local_40 = AllocateFallback(this,bytes);
  }
  else {
    local_40 = this->alloc_ptr_ + local_50;
    this->alloc_ptr_ = this->alloc_ptr_ + uVar1;
    this->alloc_bytes_remaining_ = this->alloc_bytes_remaining_ - uVar1;
  }
  if (((ulong)local_40 & 7) == 0) {
    return local_40;
  }
  __assert_fail("(reinterpret_cast<uintptr_t>(result) & (align - 1)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/arena.cc"
                ,0x36,"char *leveldb::Arena::AllocateAligned(size_t)");
}

Assistant:

char* Arena::AllocateAligned(size_t bytes) {
  const int align = (sizeof(void*) > 8) ? sizeof(void*) : 8;
  static_assert((align & (align - 1)) == 0,
                "Pointer size should be a power of 2");
  size_t current_mod = reinterpret_cast<uintptr_t>(alloc_ptr_) & (align - 1);
  size_t slop = (current_mod == 0 ? 0 : align - current_mod);
  size_t needed = bytes + slop;
  char* result;
  if (needed <= alloc_bytes_remaining_) {
    result = alloc_ptr_ + slop;
    alloc_ptr_ += needed;
    alloc_bytes_remaining_ -= needed;
  } else {
    // AllocateFallback always returned aligned memory
    result = AllocateFallback(bytes);
  }
  assert((reinterpret_cast<uintptr_t>(result) & (align - 1)) == 0);
  return result;
}